

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::UListLeaf::~UListLeaf
          (UListLeaf *this)

{
  undefined8 *in_RDI;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *unaff_retaddr;
  
  *in_RDI = &PTR__UListLeaf_01310d38;
  Lib::List<Inferences::ALASCA::SuperpositionConf::Lhs>::destroy(unaff_retaddr);
  SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Leaf::~Leaf((Leaf *)0x496bc2);
  return;
}

Assistant:

~UListLeaf()
  {
    LDList::destroy(_children);
  }